

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_tools.h
# Opt level: O0

void math::matrix_transpose_multiply<double>(double *mat_a,int rows,int cols,double *mat_res)

{
  int local_50;
  int local_4c;
  int c2;
  int c1;
  double *R_iter;
  double *pdStack_38;
  int ri;
  double *A_row;
  double *A_trans_iter;
  double *local_20;
  double *mat_res_local;
  int cols_local;
  int rows_local;
  double *mat_a_local;
  
  A_trans_iter = (double *)0x0;
  local_20 = mat_res;
  mat_res_local._0_4_ = cols;
  mat_res_local._4_4_ = rows;
  _cols_local = mat_a;
  std::fill<double*,double>(mat_res,mat_res + cols * cols,(double *)&A_trans_iter);
  A_row = _cols_local;
  pdStack_38 = _cols_local;
  for (R_iter._4_4_ = 0; R_iter._4_4_ < mat_res_local._4_4_; R_iter._4_4_ = R_iter._4_4_ + 1) {
    _c2 = local_20;
    for (local_4c = 0; local_4c < (int)mat_res_local; local_4c = local_4c + 1) {
      for (local_50 = 0; local_50 < (int)mat_res_local; local_50 = local_50 + 1) {
        *_c2 = pdStack_38[local_50] * *A_row + *_c2;
        _c2 = _c2 + 1;
      }
      A_row = A_row + 1;
    }
    pdStack_38 = pdStack_38 + (int)mat_res_local;
  }
  return;
}

Assistant:

void
matrix_transpose_multiply (T const* mat_a, int rows, int cols, T* mat_res)
{
    std::fill(mat_res, mat_res + cols * cols, T(0));

    T const* A_trans_iter = mat_a;
    T const* A_row = mat_a;
    for (int ri = 0; ri < rows; ++ri, A_row += cols)
    {
        T* R_iter = mat_res;
        for (int c1 = 0; c1 < cols; ++c1, ++A_trans_iter)
            for (int c2 = 0; c2 < cols; ++c2, ++R_iter)
                (*R_iter) += A_row[c2] * (*A_trans_iter);
    }
}